

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_cast_long_test.cpp
# Opt level: O3

void __thiscall
reflect_value_cast_long_test_long_to_float_cast_Test::TestBody
          (reflect_value_cast_long_test_long_to_float_cast_Test *this)

{
  undefined8 uVar1;
  long lVar2;
  char *message;
  AssertHelper local_38;
  float local_30;
  undefined4 uStack_2c;
  internal local_28 [8];
  undefined8 *local_20;
  
  uVar1 = value_create_long(0xe35fc);
  lVar2 = value_to_long(uVar1);
  uVar1 = value_type_cast(uVar1,5);
  local_30 = (float)lVar2;
  local_38.data_._0_4_ = value_to_float(uVar1);
  testing::internal::CmpHelperEQ<float,float>
            (local_28,"(float)l","(float)value_to_float(v)",&local_30,(float *)&local_38);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_20 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_20;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_value_cast_test/source/reflect_value_cast_long_test.cpp"
               ,0x68,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(uStack_2c,local_30) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_2c,local_30) + 8))();
    }
  }
  if (local_20 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_20 != local_20 + 2) {
      operator_delete((undefined8 *)*local_20);
    }
    operator_delete(local_20);
  }
  value_destroy(uVar1);
  return;
}

Assistant:

TEST_F(reflect_value_cast_long_test, long_to_float_cast)
{
	value v = value_create_long(931324L);

	long l = value_to_long(v);

	v = value_type_cast(v, TYPE_FLOAT);

	EXPECT_EQ((float)l, (float)value_to_float(v));

	value_destroy(v);
}